

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

void __thiscall OpenMD::Integrator::Integrator(Integrator *this,SimInfo *info)

{
  Globals **ppGVar1;
  double *pdVar2;
  long *plVar3;
  double dVar4;
  bool bVar5;
  Globals *pGVar6;
  Velocitizer *pVVar7;
  RNEMDParameters *pRVar8;
  pointer pcVar9;
  RNEMD *pRVar10;
  FluctuatingChargeParameters *pFVar11;
  undefined8 uVar12;
  int iVar13;
  Velocitizer *this_00;
  SPFForceManager *this_01;
  ForceManager *this_02;
  RotationAlgorithm *pRVar14;
  Rattle *this_03;
  FluctuatingChargeLangevin *this_04;
  undefined **ppuVar15;
  double *pdVar16;
  pointer *__ptr;
  MethodFactory rnemdMethod;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  locale local_48 [8];
  double local_40;
  undefined8 local_38;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_00300d28;
  this->info_ = info;
  this->simParams = (Globals *)0x0;
  this->forceMan_ = (ForceManager *)0x0;
  this->rotAlgo_ = (RotationAlgorithm *)0x0;
  this->flucQ_ = (FluctuatingChargePropagator *)0x0;
  this->rattle_ = (Rattle *)0x0;
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  *(undefined8 *)
   ((long)&(this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl + 5) = 0;
  *(undefined8 *)
   ((long)&(this->rnemd_)._M_t.
           super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
           .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl + 5) = 0;
  this->stats = (Stats *)0x0;
  this->dumpWriter = (DumpWriter *)0x0;
  this->statWriter = (StatWriter *)0x0;
  (this->thermo).info_ = info;
  this->snap = info->sman_->currentSnapshot_;
  (this->progressBar)._M_t.
  super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
  super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl = (ProgressBar *)0x0;
  this->dtEps = 0.0001;
  pGVar6 = info->simParams_;
  this->simParams = pGVar6;
  if ((pGVar6->Dt).super_ParameterBase.empty_ == false) {
    dVar4 = (pGVar6->Dt).data_;
    this->dt = dVar4;
    this->dt2 = dVar4 * 0.5;
  }
  else {
    builtin_strncpy(painCave.errMsg + 0x10,": dt is not set\n",0x11);
    builtin_strncpy(painCave.errMsg,"Integrator Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  ppGVar1 = &this->simParams;
  if (((*ppGVar1)->RunTime).super_ParameterBase.empty_ == false) {
    this->runTime = ((*ppGVar1)->RunTime).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg,"Integrator Error: runTime is not set\n",0x26);
    painCave.isFatal = 1;
    simError();
  }
  pGVar6 = this->simParams;
  pdVar2 = &(pGVar6->RunTime).data_;
  pdVar16 = &(pGVar6->SampleTime).data_;
  if ((pGVar6->SampleTime).super_ParameterBase.empty_ != false) {
    pdVar16 = pdVar2;
  }
  dVar4 = *pdVar16;
  this->sampleTime = dVar4;
  this->statusTime = dVar4;
  if ((pGVar6->StatusTime).super_ParameterBase.empty_ == false) {
    this->statusTime = (pGVar6->StatusTime).data_;
  }
  pdVar16 = &(pGVar6->ThermalTime).data_;
  if ((pGVar6->ThermalTime).super_ParameterBase.empty_ != false) {
    pdVar16 = pdVar2;
  }
  this->thermalTime = *pdVar16;
  if ((pGVar6->UseInitalTime).super_ParameterBase.field_0x2b == '\0') {
    Snapshot::setTime(this->snap,0.0);
  }
  pGVar6 = *ppGVar1;
  if ((pGVar6->ResetTime).super_ParameterBase.empty_ == false) {
    this->needReset = true;
    this->resetTime = (pGVar6->ResetTime).data_;
  }
  this->needVelocityScaling = false;
  if ((pGVar6->TempSet).super_ParameterBase.empty_ == false) {
    this->needVelocityScaling = (bool)(pGVar6->TempSet).super_ParameterBase.field_0x2b;
  }
  if (this->needVelocityScaling == true) {
    if ((pGVar6->TargetTemp).super_ParameterBase.empty_ == false) {
      this->targetScalingTemp = (pGVar6->TargetTemp).data_;
    }
    else {
      memcpy(&painCave,"Integrator Error: Target Temperature must be set to turn on tempSet\n",0x45)
      ;
      painCave.isFatal = 1;
      simError();
    }
  }
  this_00 = (Velocitizer *)operator_new(0x30);
  Velocitizer::Velocitizer(this_00,info);
  pVVar7 = (this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = this_00;
  if (pVVar7 != (Velocitizer *)0x0) {
    (*pVVar7->_vptr_Velocitizer[1])();
  }
  pRVar8 = (*ppGVar1)->rnemdPars_;
  if (((pRVar8->UseRNEMD).super_ParameterBase.empty_ == false) &&
     (bVar5 = (bool)(pRVar8->UseRNEMD).super_ParameterBase.field_0x2b, this->useRNEMD = bVar5,
     bVar5 == true)) {
    local_88._0_8_ = local_88 + 0x10;
    pcVar9 = (pRVar8->Method).data_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar9,pcVar9 + (pRVar8->Method).data_._M_string_length);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::basic_string<char,OpenMD::Utils::ci_char_traits,std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,OpenMD::Utils::ci_char_traits,std::allocator<char>> *)local_68,
               local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
    iVar13 = std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
             ::compare((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_> *)
                       local_68,"SPF");
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    pRVar10 = (RNEMD *)(local_88 + 0x10);
    if ((RNEMD *)local_88._0_8_ != pRVar10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (iVar13 == 0) {
      this_01 = (SPFForceManager *)operator_new(0xd68);
      RNEMD::SPFForceManager::SPFForceManager(this_01,info);
      this->forceMan_ = (ForceManager *)this_01;
    }
    pcVar9 = ((*ppGVar1)->rnemdPars_->Method).data_._M_dataplus._M_p;
    local_88._0_8_ = pRVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar9,
               pcVar9 + ((*ppGVar1)->rnemdPars_->Method).data_._M_string_length);
    RNEMD::MethodFactory::MethodFactory((MethodFactory *)local_68,(string *)local_88);
    if ((RNEMD *)local_88._0_8_ != pRVar10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    RNEMD::MethodFactory::create((MethodFactory *)local_88,(SimInfo *)local_68,(ForceManager *)info)
    ;
    uVar12 = local_88._0_8_;
    local_88._0_8_ = (long *)0x0;
    pRVar10 = (this->rnemd_)._M_t.
              super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
              .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl;
    (this->rnemd_)._M_t.
    super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>._M_t.
    super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
    super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl = (RNEMD *)uVar12;
    if (pRVar10 != (RNEMD *)0x0) {
      (*pRVar10->_vptr_RNEMD[1])();
    }
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
    if (((*ppGVar1)->rnemdPars_->ExchangeTime).super_ParameterBase.empty_ == false) {
      local_38 = ((*ppGVar1)->rnemdPars_->ExchangeTime).data_;
      this->RNEMD_exchangeTime = (RealType)local_38;
      local_40 = this->dt;
      dVar4 = ceil((double)local_38 / local_40);
      if (1e-06 < ABS(dVar4 * local_40 - (double)local_38)) {
        this->RNEMD_exchangeTime = dVar4 * local_40;
      }
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if (this->forceMan_ == (ForceManager *)0x0) {
    this_02 = (ForceManager *)operator_new(0xc80);
    ForceManager::ForceManager(this_02,info);
    this->forceMan_ = this_02;
  }
  pRVar14 = (RotationAlgorithm *)operator_new(8);
  ppuVar15 = &PTR__RotationAlgorithm_00301210;
  pRVar14->_vptr_RotationAlgorithm = (_func_int **)&PTR__RotationAlgorithm_00301210;
  this->rotAlgo_ = pRVar14;
  this_03 = (Rattle *)operator_new(0x68);
  Rattle::Rattle(this_03,info);
  this->rattle_ = this_03;
  pFVar11 = this->simParams->flucQpars_;
  if ((pFVar11->Propagator).super_ParameterBase.empty_ != false) goto LAB_0023d297;
  plVar3 = (long *)(local_88 + 0x10);
  pcVar9 = (pFVar11->Propagator).data_._M_dataplus._M_p;
  local_88._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar9,pcVar9 + (pFVar11->Propagator).data_._M_string_length);
  std::locale::locale(local_48);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (OpenMD *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (locale *)ppuVar15);
  std::locale::~locale(local_48);
  if ((long *)local_88._0_8_ != plVar3) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  iVar13 = std::__cxx11::string::compare(local_68);
  if (iVar13 == 0) {
    this_04 = (FluctuatingChargeLangevin *)operator_new(0x88);
    FluctuatingChargeNVT::FluctuatingChargeNVT((FluctuatingChargeNVT *)this_04,info);
LAB_0023d275:
    this->flucQ_ = &this_04->super_FluctuatingChargePropagator;
  }
  else {
    iVar13 = std::__cxx11::string::compare(local_68);
    if (iVar13 == 0) {
      this_04 = (FluctuatingChargeLangevin *)operator_new(0x50);
      FluctuatingChargeNVE::FluctuatingChargeNVE((FluctuatingChargeNVE *)this_04,info);
      goto LAB_0023d275;
    }
    iVar13 = std::__cxx11::string::compare(local_68);
    if (iVar13 == 0) {
      this_04 = (FluctuatingChargeLangevin *)operator_new(0x90);
      FluctuatingChargeLangevin::FluctuatingChargeLangevin(this_04,info);
      goto LAB_0023d275;
    }
    iVar13 = std::__cxx11::string::compare(local_68);
    if (iVar13 == 0) {
      this_04 = (FluctuatingChargeLangevin *)operator_new(0x58);
      FluctuatingChargeDamped::FluctuatingChargeDamped((FluctuatingChargeDamped *)this_04,info);
      goto LAB_0023d275;
    }
    pcVar9 = ((*ppGVar1)->flucQpars_->Propagator).data_._M_dataplus._M_p;
    local_88._0_8_ = plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar9,
               pcVar9 + ((*ppGVar1)->flucQpars_->Propagator).data_._M_string_length);
    snprintf(painCave.errMsg,2000,
             "Integrator Error: Unknown Fluctuating Charge propagator (%s) requested\n",
             local_88._0_8_);
    if ((long *)local_88._0_8_ != plVar3) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    painCave.isFatal = 1;
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
LAB_0023d297:
  (*this->flucQ_->_vptr_FluctuatingChargePropagator[9])(this->flucQ_,this->forceMan_);
  return;
}

Assistant:

Integrator::Integrator(SimInfo* info) :
      info_(info), forceMan_(NULL), rotAlgo_(NULL), flucQ_(NULL), rattle_(NULL),
      velocitizer_(nullptr), needPotential(false), needVirial(false),
      needReset(false), needVelocityScaling(false), useRNEMD(false),
      dumpWriter(NULL), statWriter(NULL), thermo(info_),
      snap(info_->getSnapshotManager()->getCurrentSnapshot()) {
    simParams = info->getSimParams();

    if (simParams->haveDt()) {
      dt  = simParams->getDt();
      dt2 = 0.5 * dt;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParams->haveRunTime()) {
      runTime = simParams->getRunTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: runTime is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    // set the status, sample, and thermal kick times
    if (simParams->haveSampleTime()) {
      sampleTime = simParams->getSampleTime();
      statusTime = sampleTime;
    } else {
      sampleTime = simParams->getRunTime();
      statusTime = sampleTime;
    }

    if (simParams->haveStatusTime()) {
      statusTime = simParams->getStatusTime();
    }

    if (simParams->haveThermalTime()) {
      thermalTime = simParams->getThermalTime();
    } else {
      thermalTime = simParams->getRunTime();
    }

    if (!simParams->getUseInitalTime()) { snap->setTime(0.0); }

    if (simParams->haveResetTime()) {
      needReset = true;
      resetTime = simParams->getResetTime();
    }

    // check for the temperature set flag (velocity scaling)
    needVelocityScaling = false;
    if (simParams->haveTempSet()) {
      needVelocityScaling = simParams->getTempSet();
    }

    if (needVelocityScaling) {
      if (simParams->haveTargetTemp()) {
        targetScalingTemp = simParams->getTargetTemp();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Target Temperature must be set to turn on "
                 "tempSet\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    // Create a default a velocitizer: If the subclass wants to use
    // a different velocitizer, use setVelocitizer
    velocitizer_ = std::make_unique<Velocitizer>(info);

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      useRNEMD = simParams->getRNEMDParameters()->getUseRNEMD();

      if (useRNEMD) {
        // ForceManager will only be changed if SPF-RNEMD is enabled
        if (Utils::traits_cast<Utils::ci_char_traits>(
                simParams->getRNEMDParameters()->getMethod()) == "SPF") {
          forceMan_ = new RNEMD::SPFForceManager(info);
        }

        RNEMD::MethodFactory rnemdMethod {
            simParams->getRNEMDParameters()->getMethod()};
        rnemd_ = rnemdMethod.create(info, forceMan_);

        if (simParams->getRNEMDParameters()->haveExchangeTime()) {
          RNEMD_exchangeTime =
              simParams->getRNEMDParameters()->getExchangeTime();

          // check to make sure exchange time is a multiple of dt;
          RealType newET = ceil(RNEMD_exchangeTime / dt) * dt;
          if (std::fabs(newET - RNEMD_exchangeTime) > 1e-6) {
            RNEMD_exchangeTime = newET;
          }
        }
      }
    }

    if (forceMan_ == NULL) forceMan_ = new ForceManager(info);

    rotAlgo_ = new DLM();
    rattle_  = new Rattle(info);

    if (simParams->getFluctuatingChargeParameters()->havePropagator()) {
      std::string prop = toUpperCopy(
          simParams->getFluctuatingChargeParameters()->getPropagator());
      if (prop.compare("NVT") == 0) {
        flucQ_ = new FluctuatingChargeNVT(info);
      } else if (prop.compare("NVE") == 0) {
        flucQ_ = new FluctuatingChargeNVE(info);
      } else if (prop.compare("LANGEVIN") == 0) {
        flucQ_ = new FluctuatingChargeLangevin(info);
      } else if (prop.compare("DAMPED") == 0) {
        flucQ_ = new FluctuatingChargeDamped(info);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Unknown Fluctuating Charge propagator (%s) "
                 "requested\n",
                 simParams->getFluctuatingChargeParameters()
                     ->getPropagator()
                     .c_str());
        painCave.isFatal = 1;
      }
    }

    flucQ_->setForceManager(forceMan_);
  }